

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSHcode curl_share_cleanup(Curl_share *share)

{
  CURLSHcode CVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (share == (Curl_share *)0x0) {
    CVar1 = CURLSHE_INVALID;
  }
  else {
    if (share->lockfunc != (curl_lock_function)0x0) {
      (*share->lockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE,share->clientdata)
      ;
    }
    if (share->dirty == 0) {
      Curl_conncache_close_all_connections(&share->conn_cache);
      Curl_conncache_destroy(&share->conn_cache);
      Curl_hash_destroy(&share->hostcache);
      Curl_cookie_cleanup(share->cookies);
      if (share->sslsession != (curl_ssl_session *)0x0) {
        lVar2 = 0;
        for (uVar3 = 0; uVar3 < share->max_ssl_sessions; uVar3 = uVar3 + 1) {
          Curl_ssl_kill_session((curl_ssl_session *)((long)&share->sslsession->name + lVar2));
          lVar2 = lVar2 + 0x88;
        }
        (*Curl_cfree)(share->sslsession);
      }
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
      (*Curl_cfree)(share);
      CVar1 = CURLSHE_OK;
    }
    else {
      CVar1 = CURLSHE_IN_USE;
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
    }
  }
  return CVar1;
}

Assistant:

CURLSHcode
curl_share_cleanup(struct Curl_share *share)
{
  if(share == NULL)
    return CURLSHE_INVALID;

  if(share->lockfunc)
    share->lockfunc(NULL, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE,
                    share->clientdata);

  if(share->dirty) {
    if(share->unlockfunc)
      share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
    return CURLSHE_IN_USE;
  }

  Curl_conncache_close_all_connections(&share->conn_cache);
  Curl_conncache_destroy(&share->conn_cache);
  Curl_hash_destroy(&share->hostcache);

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
  Curl_cookie_cleanup(share->cookies);
#endif

#ifdef USE_SSL
  if(share->sslsession) {
    size_t i;
    for(i = 0; i < share->max_ssl_sessions; i++)
      Curl_ssl_kill_session(&(share->sslsession[i]));
    free(share->sslsession);
  }
#endif

  Curl_psl_destroy(&share->psl);

  if(share->unlockfunc)
    share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
  free(share);

  return CURLSHE_OK;
}